

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

Option * __thiscall
CLI::App::add_set_ignore_case
          (App *this,string *name,string *member,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *options,string *description,bool defaulted)

{
  reference pvVar1;
  Option *pOVar2;
  char *pcVar3;
  string *description_00;
  string local_250;
  string local_230;
  allocator local_209;
  undefined1 local_208 [32];
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  allocator local_181;
  string local_180 [8];
  string typeval;
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_140;
  string local_120;
  Option *local_100;
  Option *opt;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  string local_c0 [32];
  undefined1 local_a0 [8];
  callback_t fun;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  string local_58 [8];
  string simple_name;
  bool defaulted_local;
  string *description_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *options_local;
  string *member_local;
  string *name_local;
  App *this_local;
  
  simple_name.field_2._M_local_buf[0xf] = defaulted;
  detail::split(&local_70,name,',');
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&local_70,0);
  ::std::__cxx11::string::string(local_58,(string *)pvVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  opt = (Option *)member;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&local_f0,options);
  ::std::__cxx11::string::string(local_c0,local_58);
  ::std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
  function<CLI::App::add_set_ignore_case(std::__cxx11::string,std::__cxx11::string&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::__cxx11::string,bool)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)_1_,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
              *)local_a0,(anon_class_88_3_1d669d6f *)&opt);
  add_set_ignore_case(std::__cxx11::string,std::__cxx11::string&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::__cxx11::string,bool)
  ::{lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)#1}::~vector
            ((_lambda_std__vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>__1_ *)
             &opt);
  ::std::__cxx11::string::string((string *)&local_120,(string *)name);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function(&local_140,
             (function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              *)local_a0);
  ::std::__cxx11::string::string((string *)(typeval.field_2._M_local_buf + 8),(string *)description)
  ;
  description_00 = (string *)((long)&typeval.field_2 + 8);
  pOVar2 = add_option(this,&local_120,&local_140,description_00,
                      (bool)(simple_name.field_2._M_local_buf[0xf] & 1));
  ::std::__cxx11::string::~string((string *)(typeval.field_2._M_local_buf + 8));
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function(&local_140);
  ::std::__cxx11::string::~string((string *)&local_120);
  local_100 = pOVar2;
  pcVar3 = detail::
           type_name<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     ();
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_180,pcVar3,&local_181);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_181);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_208,",",&local_209);
  detail::
  join<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
            ((string *)(local_208 + 0x20),(detail *)options,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_208,description_00);
  ::std::operator+(&local_1c8," in {",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_208 + 0x20));
  ::std::operator+(&local_1a8,&local_1c8,"}");
  ::std::__cxx11::string::operator+=(local_180,(string *)&local_1a8);
  ::std::__cxx11::string::~string((string *)&local_1a8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)(local_208 + 0x20));
  ::std::__cxx11::string::~string((string *)local_208);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_209);
  pOVar2 = local_100;
  ::std::__cxx11::string::string((string *)&local_230,local_180);
  Option::set_custom_option(pOVar2,&local_230,1);
  ::std::__cxx11::string::~string((string *)&local_230);
  pOVar2 = local_100;
  if ((simple_name.field_2._M_local_buf[0xf] & 1U) != 0) {
    ::std::__cxx11::string::string((string *)&local_250,(string *)member);
    Option::set_default_str(pOVar2,&local_250);
    ::std::__cxx11::string::~string((string *)&local_250);
  }
  pOVar2 = local_100;
  ::std::__cxx11::string::~string(local_180);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
               *)local_a0);
  ::std::__cxx11::string::~string(local_58);
  return pOVar2;
}

Assistant:

Option *add_set_ignore_case(std::string name,
                                std::string &member,           ///< The selected member of the set
                                std::set<std::string> options, ///< The set of posibilities
                                std::string description,
                                bool defaulted) {

        std::string simple_name = CLI::detail::split(name, ',').at(0);
        CLI::callback_t fun = [&member, options, simple_name](CLI::results_t res) {
            member = detail::to_lower(res[0]);
            auto iter = std::find_if(std::begin(options), std::end(options), [&member](std::string val) {
                return detail::to_lower(val) == member;
            });
            if(iter == std::end(options))
                throw ConversionError(member, simple_name);
            else {
                member = *iter;
                return true;
            }
        };

        Option *opt = add_option(name, fun, description, defaulted);
        std::string typeval = detail::type_name<std::string>();
        typeval += " in {" + detail::join(options) + "}";
        opt->set_custom_option(typeval);
        if(defaulted) {
            opt->set_default_str(member);
        }
        return opt;
    }